

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::CollectMemOpInfo
          (GlobOpt *this,Instr *instrBegin,Instr *instr,Value *src1Val,Value *src2Val)

{
  OpCode OVar1;
  Type pSVar2;
  Opnd *this_00;
  BasicBlock *pBVar3;
  Instr *pIVar4;
  SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_02;
  InductionVariableChangeInfoMap *this_03;
  code *pcVar5;
  bool bVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  SymID SVar10;
  undefined4 *puVar11;
  JITTimeFunctionBody *pJVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  RegOpnd *pRVar15;
  Value *pVVar16;
  Type *ppMVar17;
  MemCopyCandidate *pMVar18;
  StackSym *pSVar19;
  StackSym *pSVar20;
  IntConstOpnd *pIVar21;
  InductionVariableChangeInfo *pIVar22;
  Instr *pIVar23;
  Loop *loop;
  GlobOpt *pGVar24;
  SymID *pSVar25;
  SymID local_b8 [2];
  char16 debugStringBuffer [42];
  uint local_34 [2];
  int constValue;
  
  loop = this->currentBlock->loop;
  if (loop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x86d,"(this->currentBlock->loop)","this->currentBlock->loop");
    if (!bVar6) goto LAB_00424221;
    *puVar11 = 0;
    loop = this->currentBlock->loop;
  }
  pSVar2 = (loop->blockList).super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListNodeBase<Memory::ArenaAllocator>.next;
  if ((SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)pSVar2 == &loop->blockList) {
    return false;
  }
  if ((SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)pSVar2->next->next !=
      &loop->blockList) {
    return false;
  }
  if ((((byte)loop->loopFlags >> 1 | ~(byte)loop->loopFlags) & 1) == 0) {
    if (DAT_0145948a == '\x01') {
      uVar8 = Func::GetSourceContextId(this->func);
      uVar9 = Func::GetLocalFunctionId(this->func);
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemOpPhase,uVar8,uVar9);
      if (!bVar6) {
        uVar8 = Func::GetSourceContextId(this->func);
        uVar9 = Func::GetLocalFunctionId(this->func);
        bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemSetPhase,uVar8,uVar9);
        if (!bVar6) {
          uVar8 = Func::GetSourceContextId(this->func);
          uVar9 = Func::GetLocalFunctionId(this->func);
          bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemCopyPhase,uVar8,uVar9);
          if (!bVar6) goto LAB_00424075;
        }
      }
      Output::Print(L"TRACE MemOp:");
      pJVar12 = Func::GetJITFunctionBody(this->func);
      pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      pcVar14 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_b8);
      uVar8 = Loop::GetLoopNumber(loop);
      Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar13,pcVar14,(ulong)uVar8);
      Output::Print(L"minimum loop count not reached");
      if (instr != (Instr *)0x0) {
        IR::Instr::DumpByteCodeOffset(instr);
        pcVar13 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
        Output::Print(L" (%s)",pcVar13);
      }
      Output::Print(L"\n");
      Output::Flush();
    }
    goto LAB_00424075;
  }
  if ((loop->field_0x179 & 4) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x87d,"(loop->doMemOp)","loop->doMemOp");
    if (!bVar6) goto LAB_00424221;
    *puVar11 = 0;
  }
  OVar1 = instr->m_opcode;
  if (OVar1 == LdElemI_A) {
    bVar6 = CollectMemOpLdElementI(this,instr,loop);
  }
  else {
    if (OVar1 != StElemI_A) {
      if (OVar1 == Sub_I4) {
        bVar7 = 0;
LAB_00423b4f:
        pIVar4 = instr->m_next;
        pSVar19 = IR::Opnd::GetStackSym(instr->m_dst);
        if ((pSVar19 == (StackSym *)0x0) || (bVar6 = IR::Opnd::IsRegOpnd(instr->m_dst), !bVar6)) {
LAB_00423c20:
          bVar6 = false;
        }
        else {
          pSVar19 = IR::Opnd::GetStackSym(instr->m_dst);
          pSVar20 = IR::Opnd::GetStackSym(instr->m_src1);
          if (pSVar19 != pSVar20) {
            if ((((pIVar4 != (Instr *)0x0) && (pIVar4->m_opcode == Ld_A)) &&
                (bVar6 = IR::Opnd::IsRegOpnd(pIVar4->m_src1), bVar6)) &&
               (bVar6 = IR::Opnd::IsRegOpnd(pIVar4->m_dst), bVar6)) {
              pGVar24 = (GlobOpt *)instr->m_dst;
              pSVar19 = IR::Opnd::GetStackSym((Opnd *)pGVar24);
              SVar10 = GetVarSymID(pGVar24,pSVar19);
              pSVar19 = IR::Opnd::GetStackSym(pIVar4->m_src1);
              if (SVar10 == (pSVar19->super_Sym).m_id) {
                pGVar24 = (GlobOpt *)instr->m_src1;
                pSVar19 = IR::Opnd::GetStackSym((Opnd *)pGVar24);
                SVar10 = GetVarSymID(pGVar24,pSVar19);
                pSVar19 = IR::Opnd::GetStackSym(pIVar4->m_dst);
                if (SVar10 == (pSVar19->super_Sym).m_id) goto LAB_00423c1b;
              }
            }
            goto LAB_00423c20;
          }
LAB_00423c1b:
          bVar6 = true;
        }
        pGVar24 = (GlobOpt *)instr->m_src1;
        pSVar19 = IR::Opnd::GetStackSym((Opnd *)pGVar24);
        local_b8[0] = GetVarSymID(pGVar24,pSVar19);
        if ((bVar6) &&
           (bVar6 = IsSymIDInductionVariable(pGVar24,local_b8[0],this->currentBlock->loop), bVar6))
        {
          this_00 = instr->m_src2;
          bVar6 = IR::Opnd::IsRegOpnd(this_00);
          if (bVar6) {
            pBVar3 = this->currentBlock;
            pRVar15 = IR::Opnd::AsRegOpnd(this_00);
            pVVar16 = GlobOptBlockData::FindValue(&pBVar3->globOptData,&pRVar15->m_sym->super_Sym);
            if (pVVar16 == (Value *)0x0) goto LAB_004240b7;
            if (pVVar16->valueInfo == (ValueInfo *)0x0) {
              bVar6 = false;
            }
            else {
              bVar6 = ValueInfo::TryGetIntConstantValue(pVVar16->valueInfo,(int32 *)local_34,false);
              bVar6 = local_34[0] == 1 && bVar6;
            }
LAB_004240c7:
            Loop::EnsureMemOpVariablesInitialized(loop);
            if (bVar6) {
              bVar6 = JsUtil::
                      BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      ::ContainsKey(loop->memOpInfo->inductionVariableChangeInfoMap,local_b8);
              if (!bVar6) {
                local_34[0] = CONCAT31(local_34[0]._1_3_,bVar7) | 1;
                JsUtil::
                BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::
                Insert<(JsUtil::BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                          ((BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                            *)loop->memOpInfo->inductionVariableChangeInfoMap,local_b8,
                           (InductionVariableChangeInfo *)local_34);
                if ((pSVar19->super_Sym).m_id == local_b8[0]) {
                  return true;
                }
                goto LAB_00424202;
              }
              local_34[0] = (uint)local_34[0]._1_3_ << 8;
              pIVar22 = JsUtil::
                        BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                        ::LookupWithKey<unsigned_int>
                                  (loop->memOpInfo->inductionVariableChangeInfoMap,local_b8,
                                   (InductionVariableChangeInfo *)local_34);
              local_34[0] = CONCAT31(local_34[0]._1_3_,
                                     ((char)*pIVar22 + 1U) - ((~(byte)*pIVar22 & 0x7f) == 0) & 0x7f
                                     | bVar7);
              JsUtil::
              BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::
              Insert<(JsUtil::BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                        ((BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)loop->memOpInfo->inductionVariableChangeInfoMap,local_b8,
                         (InductionVariableChangeInfo *)local_34);
              if ((pSVar19->super_Sym).m_id == local_b8[0]) {
                return true;
              }
              goto LAB_004241a6;
            }
          }
          else {
            bVar6 = IR::Opnd::IsIntConstOpnd(this_00);
            if (bVar6) {
              pIVar21 = IR::Opnd::AsIntConstOpnd(this_00);
              bVar6 = (pIVar21->super_EncodableOpnd<long>).m_value == 1;
              goto LAB_004240c7;
            }
LAB_004240b7:
            Loop::EnsureMemOpVariablesInitialized(loop);
          }
          local_34[0] = CONCAT31(local_34[0]._1_3_,0x7f);
          bVar6 = JsUtil::
                  BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::ContainsKey(loop->memOpInfo->inductionVariableChangeInfoMap,local_b8);
          this_03 = loop->memOpInfo->inductionVariableChangeInfoMap;
          pSVar25 = &(pSVar19->super_Sym).m_id;
          if (!bVar6) {
            JsUtil::
            BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::
            Insert<(JsUtil::BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                      ((BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)this_03,local_b8,(InductionVariableChangeInfo *)local_34);
            if (*pSVar25 == local_b8[0]) {
              return true;
            }
LAB_00424202:
            JsUtil::
            BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::
            Insert<(JsUtil::BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                      ((BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)loop->memOpInfo->inductionVariableChangeInfoMap,&(pSVar19->super_Sym).m_id
                       ,(InductionVariableChangeInfo *)local_34);
            return true;
          }
          JsUtil::
          BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                    ((BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_03,local_b8,(InductionVariableChangeInfo *)local_34);
          if (*pSVar25 == local_b8[0]) {
            return true;
          }
LAB_004241a6:
          JsUtil::
          BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                    ((BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)loop->memOpInfo->inductionVariableChangeInfoMap,&(pSVar19->super_Sym).m_id,
                     (InductionVariableChangeInfo *)local_34);
          return true;
        }
      }
      else {
        if (OVar1 == Add_I4) {
          bVar7 = 0x80;
          goto LAB_00423b4f;
        }
        if (OVar1 == StElemI_A_Strict) goto LAB_00423b2e;
      }
      pIVar4 = instr->m_next;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      pIVar23 = (Instr *)0x0;
      while (instrBegin = instrBegin->m_next, instrBegin != pIVar4) {
        if ((pIVar23 != (Instr *)0x0) && (pIVar23->m_next != instrBegin)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x917,
                             "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == chkInstr)"
                             ,"Modifying instr list but not using EDITING iterator!");
          if (!bVar6) goto LAB_00424221;
          *puVar11 = 0;
        }
        bVar6 = IsInstrInvalidForMemOp(this,instrBegin,loop,src1Val,src2Val);
        if (bVar6) goto LAB_00424075;
        pIVar23 = instrBegin;
        if ((loop->memOpInfo != (MemOpInfo *)0x0) &&
           (this_01 = (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)
                      loop->memOpInfo->candidates,
           (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)
           (this_01->super_SListNodeBase<Memory::ArenaAllocator>).next != this_01)) {
          ppMVar17 = SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Head
                               (this_01);
          if (((*ppMVar17)->type == MEMCOPY) &&
             ((pMVar18 = Loop::MemOpCandidate::AsMemCopy(*ppMVar17),
              (pMVar18->super_MemOpCandidate).base == 0xffffffff &&
              (bVar6 = IR::Instr::HasSymUse(instrBegin,pMVar18->transferSym), bVar6)))) {
            loop->field_0x179 = loop->field_0x179 & 0xfb;
            if (DAT_0145948a != '\x01') {
              return false;
            }
            uVar8 = Func::GetSourceContextId(this->func);
            uVar9 = Func::GetLocalFunctionId(this->func);
            bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemOpPhase,uVar8,uVar9);
            if (!bVar6) {
              uVar8 = Func::GetSourceContextId(this->func);
              uVar9 = Func::GetLocalFunctionId(this->func);
              bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemCopyPhase,uVar8,uVar9);
              if (!bVar6) {
                return false;
              }
            }
            Output::Print(L"TRACE MemCopy:");
            pJVar12 = Func::GetJITFunctionBody(this->func);
            pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
            pcVar14 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_b8);
            uVar8 = Loop::GetLoopNumber(loop);
            pGVar24 = (GlobOpt *)0xf;
            Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar13,pcVar14,(ulong)uVar8);
            SVar10 = GetVarSymID(pGVar24,pMVar18->transferSym);
            Output::Print(L"Found illegal use of LdElemI value(s%d)",(ulong)SVar10);
            IR::Instr::DumpByteCodeOffset(instrBegin);
            pcVar13 = Js::OpCodeUtil::GetOpCodeName(instrBegin->m_opcode);
            Output::Print(L" (%s)",pcVar13);
            Output::Print(L"\n");
            Output::Flush();
            return false;
          }
        }
      }
      if (instr->m_dst == (Opnd *)0x0) {
        return true;
      }
      if (instr->m_opcode == IncrLoopBodyCount) {
        return true;
      }
      if (loop->memOpInfo == (MemOpInfo *)0x0) {
        return true;
      }
      pIVar4 = instr->m_prev;
      if ((((pIVar4 != (Instr *)0x0 && instr->m_opcode == Ld_I4) &&
           ((pIVar4->m_opcode - 0x1c0 < 2 || (pIVar4->m_opcode == Ld_A)))) &&
          (bVar6 = IR::Opnd::IsRegOpnd(instr->m_src1), bVar6)) &&
         ((bVar6 = IR::Opnd::IsRegOpnd(instr->m_dst), bVar6 &&
          (bVar6 = IR::Opnd::IsRegOpnd(pIVar4->m_dst), bVar6)))) {
        pSVar19 = IR::Opnd::GetStackSym(instr->m_dst);
        pSVar20 = IR::Opnd::GetStackSym(pIVar4->m_src1);
        if (pSVar19 == pSVar20) {
          pSVar19 = IR::Opnd::GetStackSym(instr->m_src1);
          pSVar20 = IR::Opnd::GetStackSym(pIVar4->m_dst);
          if (pSVar19 == pSVar20) {
            return true;
          }
        }
      }
      this_02 = loop->memOpInfo->inductionVariableChangeInfoMap;
      pGVar24 = (GlobOpt *)instr->m_dst;
      pSVar19 = IR::Opnd::GetStackSym((Opnd *)pGVar24);
      local_b8[0] = GetVarSymID(pGVar24,pSVar19);
      bVar6 = JsUtil::
              BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(this_02,local_b8);
      if (!bVar6) {
        return true;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x94a,
                         "(!instr->GetDst() || instr->m_opcode == Js::OpCode::IncrLoopBodyCount || !loop->memOpInfo || (instr->m_opcode == Js::OpCode::Ld_I4 && prevInstr && (prevInstr->m_opcode == Js::OpCode::Add_I4 || prevInstr->m_opcode == Js::OpCode::Sub_I4 || prevInstr->m_opcode == Js::OpCode::Ld_A ) && instr->GetSrc1()->IsRegOpnd() && instr->GetDst()->IsRegOpnd() && prevInstr->GetDst()->IsRegOpnd() && instr->GetDst()->GetStackSym() == prevInstr->GetSrc1()->GetStackSym() && instr->GetSrc1()->GetStackSym() == prevInstr->GetDst()->GetStackSym()) || !loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(GetVarSymID(instr->GetDst()->GetStackSym())))"
                         ,
                         "!instr->GetDst() || instr->m_opcode == Js::OpCode::IncrLoopBodyCount || !loop->memOpInfo || (instr->m_opcode == Js::OpCode::Ld_I4 && prevInstr && (prevInstr->m_opcode == Js::OpCode::Add_I4 || prevInstr->m_opcode == Js::OpCode::Sub_I4 || prevInstr->m_opcode == Js::OpCode::Ld_A ) && instr->GetSrc1()->IsRegOpnd() && instr->GetDst()->IsRegOpnd() && prevInstr->GetDst()->IsRegOpnd() && instr->GetDst()->GetStackSym() == prevInstr->GetSrc1()->GetStackSym() && instr->GetSrc1()->GetStackSym() == prevInstr->GetDst()->GetStackSym()) || !loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(GetVarSymID(instr->GetDst()->GetStackSym()))"
                        );
      if (bVar6) {
        *puVar11 = 0;
        return true;
      }
LAB_00424221:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
LAB_00423b2e:
    bVar6 = CollectMemOpStElementI(this,instr,loop);
  }
  if (bVar6 != false) {
    return true;
  }
LAB_00424075:
  loop->field_0x179 = loop->field_0x179 & 0xfb;
  return false;
}

Assistant:

bool
GlobOpt::CollectMemOpInfo(IR::Instr *instrBegin, IR::Instr *instr, Value *src1Val, Value *src2Val)
{
    Assert(this->currentBlock->loop);

    Loop *loop = this->currentBlock->loop;

    if (!loop->blockList.HasTwo())
    {
        //  We support memcopy and memset for loops which have only two blocks.
        return false;
    }

    if (loop->GetLoopFlags().isInterpreted && !loop->GetLoopFlags().memopMinCountReached)
    {
        TRACE_MEMOP_VERBOSE(loop, instr, _u("minimum loop count not reached"))
        loop->doMemOp = false;
        return false;
    }
    Assert(loop->doMemOp);

    bool isIncr = true, isChangedByOne = false;

    switch (instr->m_opcode)
    {
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
        if (!CollectMemOpStElementI(instr, loop))
        {
            loop->doMemOp = false;
            return false;
        }
        break;
    case Js::OpCode::LdElemI_A:
        if (!CollectMemOpLdElementI(instr, loop))
        {
            loop->doMemOp = false;
            return false;
        }
        break;
    case Js::OpCode::Sub_I4:
        isIncr = false;
    case Js::OpCode::Add_I4:
    {
        // The only case in which these OpCodes can contribute to an inductionVariableChangeInfo
        // is when the induction variable is being modified and overwritten aswell (ex: j = j + 1)
        // and not when the induction variable is modified but not overwritten (ex: k = j + 1).
        // This can either be detected in IR as
        // s1     = Add_I4 s1     1  // Case #1, can be seen with "j++".
        // or as
        // s4(s2) = Add_I4 s3(s1) 1  // Case #2, can be see with "j = j + 1".
        // s1     = Ld_A   s2
        bool isInductionVar = false;
        IR::Instr* nextInstr = instr->m_next;
        if (
            // Checks for Case #1 and Case #2
            instr->GetDst()->GetStackSym() != nullptr &&
            instr->GetDst()->IsRegOpnd() &&
            (
                // Checks for Case #1
                (instr->GetDst()->GetStackSym() == instr->GetSrc1()->GetStackSym()) ||

                // Checks for Case #2
                (nextInstr&& nextInstr->m_opcode == Js::OpCode::Ld_A &&
                 nextInstr->GetSrc1()->IsRegOpnd() &&
                 nextInstr->GetDst()->IsRegOpnd() &&
                 GetVarSymID(instr->GetDst()->GetStackSym()) == nextInstr->GetSrc1()->GetStackSym()->m_id &&
                 GetVarSymID(instr->GetSrc1()->GetStackSym()) == nextInstr->GetDst()->GetStackSym()->m_id)
            )
        )
        {
            isInductionVar = true;
        }
        
        // Even if dstIsInductionVar then dst == src1 so it's safe to use src1 as the induction sym always.
        StackSym* sym = instr->GetSrc1()->GetStackSym();

        SymID inductionSymID = GetVarSymID(sym);

        if (isInductionVar && IsSymIDInductionVariable(inductionSymID, this->currentBlock->loop))
        {
            if (!isChangedByOne)
            {
                IR::Opnd *src1, *src2;
                src1 = instr->GetSrc1();
                src2 = instr->GetSrc2();

                if (src2->IsRegOpnd())
                {
                    Value *val = CurrentBlockData()->FindValue(src2->AsRegOpnd()->m_sym);
                    if (val)
                    {
                        ValueInfo *vi = val->GetValueInfo();
                        int constValue;
                        if (vi && vi->TryGetIntConstantValue(&constValue))
                        {
                            if (constValue == 1)
                            {
                                isChangedByOne = true;
                            }
                        }
                    }
                }
                else if (src2->IsIntConstOpnd())
                {
                    if (src2->AsIntConstOpnd()->GetValue() == 1)
                    {
                        isChangedByOne = true;
                    }
                }
            }

            loop->EnsureMemOpVariablesInitialized();
            if (!isChangedByOne)
            {
                Loop::InductionVariableChangeInfo inductionVariableChangeInfo = { Js::Constants::InvalidLoopUnrollFactor, 0 };

                if (!loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(inductionSymID))
                {
                    loop->memOpInfo->inductionVariableChangeInfoMap->Add(inductionSymID, inductionVariableChangeInfo);
                    if (sym->m_id != inductionSymID)
                    {
                        // Backwards pass uses this bit-vector to lookup upwardExposedUsed/bytecodeUpwardExposedUsed symbols, which are not necessarily vars.  Just add both.
                        loop->memOpInfo->inductionVariableChangeInfoMap->Add(sym->m_id, inductionVariableChangeInfo);
                    }
                }
                else
                {
                    loop->memOpInfo->inductionVariableChangeInfoMap->Item(inductionSymID, inductionVariableChangeInfo);
                    if (sym->m_id != inductionSymID)
                    {
                        // Backwards pass uses this bit-vector to lookup upwardExposedUsed/bytecodeUpwardExposedUsed symbols, which are not necessarily vars.  Just add both.
                        loop->memOpInfo->inductionVariableChangeInfoMap->Item(sym->m_id, inductionVariableChangeInfo);
                    }
                }
            }
            else
            {
                if (!loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(inductionSymID))
                {
                    Loop::InductionVariableChangeInfo inductionVariableChangeInfo = { 1, isIncr };
                    loop->memOpInfo->inductionVariableChangeInfoMap->Add(inductionSymID, inductionVariableChangeInfo);
                    if (sym->m_id != inductionSymID)
                    {
                        // Backwards pass uses this bit-vector to lookup upwardExposedUsed/bytecodeUpwardExposedUsed symbols, which are not necessarily vars.  Just add both.
                        loop->memOpInfo->inductionVariableChangeInfoMap->Add(sym->m_id, inductionVariableChangeInfo);
                    }
                }
                else
                {
                    Loop::InductionVariableChangeInfo inductionVariableChangeInfo = { 0, 0 };
                    inductionVariableChangeInfo = loop->memOpInfo->inductionVariableChangeInfoMap->Lookup(inductionSymID, inductionVariableChangeInfo);

                    // If inductionVariableChangeInfo.unroll has been invalidated, do
                    // not modify the Js::Constants::InvalidLoopUnrollFactor value
                    if (inductionVariableChangeInfo.unroll != Js::Constants::InvalidLoopUnrollFactor)
                    {
                        inductionVariableChangeInfo.unroll++;
                    }
                    inductionVariableChangeInfo.isIncremental = isIncr;
                    loop->memOpInfo->inductionVariableChangeInfoMap->Item(inductionSymID, inductionVariableChangeInfo);
                    if (sym->m_id != inductionSymID)
                    {
                        // Backwards pass uses this bit-vector to lookup upwardExposedUsed/bytecodeUpwardExposedUsed symbols, which are not necessarily vars.  Just add both.
                        loop->memOpInfo->inductionVariableChangeInfoMap->Item(sym->m_id, inductionVariableChangeInfo);
                    }
                }
            }
            break;
        }
        // Fallthrough if not an induction variable
    }
    default:
        FOREACH_INSTR_IN_RANGE(chkInstr, instrBegin->m_next, instr)
        {
            if (IsInstrInvalidForMemOp(chkInstr, loop, src1Val, src2Val))
            {
                loop->doMemOp = false;
                return false;
            }

            // Make sure this instruction doesn't use the memcopy transfer sym before it is checked by StElemI
            if (loop->memOpInfo && !loop->memOpInfo->candidates->Empty())
            {
                Loop::MemOpCandidate* prevCandidate = loop->memOpInfo->candidates->Head();
                if (prevCandidate->IsMemCopy())
                {
                    Loop::MemCopyCandidate* memcopyCandidate = prevCandidate->AsMemCopy();
                    if (memcopyCandidate->base == Js::Constants::InvalidSymID)
                    {
                        if (chkInstr->HasSymUse(memcopyCandidate->transferSym))
                        {
                            loop->doMemOp = false;
                            TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, chkInstr, _u("Found illegal use of LdElemI value(s%d)"), GetVarSymID(memcopyCandidate->transferSym));
                            return false;
                        }
                    }
                }
            }
        }
        NEXT_INSTR_IN_RANGE;
        IR::Instr* prevInstr = instr->m_prev;

        // If an instr where the dst is an induction variable (and thus is being written to) is not caught by a case in the above
        // switch statement (which implies that this instr does not contributes to a inductionVariableChangeInfo) and in the default
        // case does not set doMemOp to false (which implies that this instr does not invalidate this MemOp), then FailFast as we
        // should not be performing a MemOp under these conditions. 
        AssertOrFailFast(!instr->GetDst() || instr->m_opcode == Js::OpCode::IncrLoopBodyCount || !loop->memOpInfo ||

            // Refer to "Case #2" described above in this function. For the following IR:
            // Line #1: s4(s2) = Add_I4 s3(s1) 1
            // Line #2: s3(s1) = Ld_A   s4(s2)
            // do not consider line #2 as a violating instr
            (instr->m_opcode == Js::OpCode::Ld_I4 &&
                // note Ld_A is for the case where the add was 0
                prevInstr && (prevInstr->m_opcode == Js::OpCode::Add_I4 ||
                              prevInstr->m_opcode == Js::OpCode::Sub_I4 ||
                              prevInstr->m_opcode == Js::OpCode::Ld_A   ) &&
                instr->GetSrc1()->IsRegOpnd() &&
                instr->GetDst()->IsRegOpnd() &&
                prevInstr->GetDst()->IsRegOpnd() &&
                instr->GetDst()->GetStackSym() == prevInstr->GetSrc1()->GetStackSym() &&
                instr->GetSrc1()->GetStackSym() == prevInstr->GetDst()->GetStackSym()) ||

            !loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(GetVarSymID(instr->GetDst()->GetStackSym())));
    }

    return true;
}